

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryBase.hpp
# Opt level: O3

void __thiscall
Diligent::QueryBase<Diligent::EngineGLImplTraits>::~QueryBase
          (QueryBase<Diligent::EngineGLImplTraits> *this)

{
  char (*in_R8) [64];
  string _msg;
  string local_28;
  
  (this->
  super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>).
  super_ObjectBase<Diligent::IQueryGL>.super_RefCountedObject<Diligent::IQueryGL>.super_IQueryGL.
  super_IQuery.super_IDeviceObject.super_IObject = (IObject)&PTR_QueryInterface_00af5450;
  if (this->m_State == Querying) {
    FormatString<char[19],char_const*,char[64]>
              (&local_28,(Diligent *)"Destroying query \'",
               (char (*) [19])
               &(this->
                super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>
                ).m_Desc,(char **)"\' that is in querying state. End the query before releasing it."
               ,in_R8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,local_28._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
  }
  RefCntAutoPtr<Diligent::DeviceContextGLImpl>::Release(&this->m_pContext);
  DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>::
  ~DeviceObjectBase(&this->
                     super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>
                   );
  return;
}

Assistant:

~QueryBase()
    {
        if (m_State == QueryState::Querying)
        {
            LOG_ERROR_MESSAGE("Destroying query '", this->m_Desc.Name,
                              "' that is in querying state. End the query before releasing it.");
        }
    }